

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O0

void njd_set_digit(NJD *njd)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  NJDNode *in_RDI;
  bool bVar4;
  NJD *unaff_retaddr;
  int find;
  NJDNode *node;
  NJDNode *e;
  NJDNode *s;
  int j;
  int i;
  NJDNode *in_stack_000003d0;
  NJDNode *in_stack_000003d8;
  char **in_stack_000003e0;
  char *in_stack_000017e8;
  NJDNode *in_stack_000017f0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  NJDNode *in_stack_ffffffffffffffc0;
  NJDNode *in_stack_ffffffffffffffc8;
  NJDNode *pNVar5;
  _NJDNode *p_Var6;
  NJDNode *list;
  NJDNode *local_18;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  local_18 = (NJDNode *)0x0;
  list = (NJDNode *)0x0;
  bVar4 = false;
  for (pNVar5 = (NJDNode *)in_RDI->string; pNVar5 != (NJDNode *)0x0; pNVar5 = pNVar5->next) {
    if (!bVar4) {
      pcVar3 = NJDNode_get_pos_group1(pNVar5);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_b48b2 + 9);
      if (iVar1 == 0) {
        bVar4 = true;
      }
    }
    iVar1 = get_digit(in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    if (iVar1 < 0) {
      pcVar3 = NJDNode_get_pos_group1(pNVar5);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_b48b2 + 9);
      if (iVar1 == 0) {
        NJDNode_get_string(pNVar5);
        iVar1 = is_period((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        if (iVar1 != 1) {
          NJDNode_get_string(pNVar5);
          iVar1 = is_comma((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
          if (iVar1 != 1) goto LAB_00181d97;
        }
        goto LAB_00181d69;
      }
LAB_00181d97:
      if (local_18 != (NJDNode *)0x0) {
        list = pNVar5->prev;
      }
    }
    else {
LAB_00181d69:
      if (local_18 == (NJDNode *)0x0) {
        local_18 = pNVar5;
      }
      if (pNVar5 == (NJDNode *)in_RDI->pos) {
        list = pNVar5;
      }
    }
    if ((local_18 != (NJDNode *)0x0) && (list != (NJDNode *)0x0)) {
      convert_digit_sequence
                (unaff_retaddr,in_RDI,
                 (NJDNode *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
      list = (NJDNode *)0x0;
      local_18 = (NJDNode *)0x0;
    }
  }
  if ((bVar4) &&
     (NJD_remove_silent_node((NJD *)in_stack_ffffffffffffffc0), in_RDI->string != (char *)0x0)) {
    pNVar5 = *(NJDNode **)(in_RDI->string + 0x70);
LAB_00181e31:
    bVar4 = false;
    if (pNVar5 != (NJDNode *)0x0) {
      bVar4 = pNVar5->next != (_NJDNode *)0x0;
    }
    if (bVar4) {
      pcVar3 = NJDNode_get_string(pNVar5);
      iVar1 = strcmp(pcVar3,"*");
      if (iVar1 != 0) {
        pcVar3 = NJDNode_get_string(pNVar5->prev);
        iVar1 = strcmp(pcVar3,"*");
        if (iVar1 != 0) {
          NJDNode_get_string(pNVar5);
          iVar1 = is_period((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
          if (iVar1 == 1) {
            pcVar3 = NJDNode_get_pos_group1(pNVar5->prev);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_b48b2 + 9);
            if (iVar1 == 0) {
              pcVar3 = NJDNode_get_pos_group1(pNVar5->next);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_b48b2 + 9);
              if (iVar1 == 0) {
                NJDNode_load(in_stack_000017f0,in_stack_000017e8);
                NJDNode_set_chain_flag(pNVar5,1);
                pcVar3 = NJDNode_get_string(pNVar5->prev);
                iVar1 = strcmp(pcVar3,anon_var_dwarf_b2caf);
                if (iVar1 == 0) {
LAB_00181f70:
                  NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                   (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                    in_stack_ffffffffffffffb8));
                  NJDNode_set_mora_size(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
                }
                else {
                  pcVar3 = NJDNode_get_string(pNVar5->prev);
                  iVar1 = strcmp(pcVar3,anon_var_dwarf_13ce);
                  if (iVar1 == 0) goto LAB_00181f70;
                  pcVar3 = NJDNode_get_string(pNVar5->prev);
                  iVar1 = strcmp(pcVar3,anon_var_dwarf_b2cdc);
                  if (iVar1 == 0) {
                    NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                     (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                      in_stack_ffffffffffffffb8));
                    NJDNode_set_mora_size(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
                  }
                  else {
                    pcVar3 = NJDNode_get_string(pNVar5->prev);
                    iVar1 = strcmp(pcVar3,anon_var_dwarf_b2cf2);
                    if (iVar1 == 0) {
                      NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                       (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                        in_stack_ffffffffffffffb8));
                      NJDNode_set_mora_size(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
                    }
                    else {
                      pcVar3 = NJDNode_get_string(pNVar5->prev);
                      iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d08);
                      if (iVar1 == 0) {
                        NJDNode_set_acc(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
                      }
                    }
                  }
                }
                pNVar5 = pNVar5->next;
                while( true ) {
                  bVar4 = false;
                  if (pNVar5 != (NJDNode *)0x0) {
                    pcVar3 = NJDNode_get_pos(pNVar5);
                    iVar1 = strcmp(pcVar3,anon_var_dwarf_b6741 + 0xd);
                    bVar4 = iVar1 == 0;
                  }
                  if (!bVar4) break;
                  pNVar5 = pNVar5->next;
                }
                if (pNVar5 != (NJDNode *)0x0) {
                  pNVar5 = pNVar5->next;
                }
                goto LAB_00181e31;
              }
            }
          }
        }
      }
      pNVar5 = pNVar5->next;
      goto LAB_00181e31;
    }
    for (p_Var6 = *(_NJDNode **)(in_RDI->string + 0x70); p_Var6 != (_NJDNode *)0x0;
        p_Var6 = p_Var6->next) {
      pcVar3 = NJDNode_get_pos_group1(p_Var6->prev);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_b48b2 + 9);
      if (iVar1 == 0) {
        pcVar3 = NJDNode_get_pos_group2(p_Var6);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d1e);
        if (iVar1 != 0) {
          pcVar3 = NJDNode_get_pos_group1(p_Var6);
          iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d35);
          if (iVar1 != 0) goto LAB_001824ba;
        }
        iVar1 = search_numerative_class
                          (&in_stack_ffffffffffffffc8->string,in_stack_ffffffffffffffc0);
        if (iVar1 == 1) {
          convert_digit_pron(&list->string,p_Var6);
        }
        else {
          iVar1 = search_numerative_class
                            (&in_stack_ffffffffffffffc8->string,in_stack_ffffffffffffffc0);
          if (iVar1 == 1) {
            convert_digit_pron(&list->string,p_Var6);
          }
          else {
            iVar1 = search_numerative_class
                              (&in_stack_ffffffffffffffc8->string,in_stack_ffffffffffffffc0);
            if (iVar1 == 1) {
              convert_digit_pron(&list->string,p_Var6);
            }
            else {
              iVar1 = search_numerative_class
                                (&in_stack_ffffffffffffffc8->string,in_stack_ffffffffffffffc0);
              if (iVar1 == 1) {
                convert_digit_pron(&list->string,p_Var6);
              }
              else {
                iVar1 = search_numerative_class
                                  (&in_stack_ffffffffffffffc8->string,in_stack_ffffffffffffffc0);
                if (iVar1 == 1) {
                  convert_digit_pron(&list->string,p_Var6);
                }
                else {
                  iVar1 = search_numerative_class
                                    (&in_stack_ffffffffffffffc8->string,in_stack_ffffffffffffffc0);
                  if (iVar1 == 1) {
                    convert_digit_pron(&list->string,p_Var6);
                  }
                  else {
                    iVar1 = search_numerative_class
                                      (&in_stack_ffffffffffffffc8->string,in_stack_ffffffffffffffc0)
                    ;
                    if (iVar1 == 1) {
                      convert_digit_pron(&list->string,p_Var6);
                    }
                    else {
                      iVar1 = search_numerative_class
                                        (&in_stack_ffffffffffffffc8->string,
                                         in_stack_ffffffffffffffc0);
                      if (iVar1 == 1) {
                        convert_digit_pron(&list->string,p_Var6);
                      }
                      else {
                        iVar1 = search_numerative_class
                                          (&in_stack_ffffffffffffffc8->string,
                                           in_stack_ffffffffffffffc0);
                        if (iVar1 == 1) {
                          convert_digit_pron(&list->string,p_Var6);
                        }
                        else {
                          iVar1 = search_numerative_class
                                            (&in_stack_ffffffffffffffc8->string,
                                             in_stack_ffffffffffffffc0);
                          if (iVar1 == 1) {
                            convert_digit_pron(&list->string,p_Var6);
                          }
                          else {
                            iVar1 = search_numerative_class
                                              (&in_stack_ffffffffffffffc8->string,
                                               in_stack_ffffffffffffffc0);
                            if (iVar1 == 1) {
                              convert_digit_pron(&list->string,p_Var6);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        iVar1 = search_numerative_class
                          (&in_stack_ffffffffffffffc8->string,in_stack_ffffffffffffffc0);
        if (iVar1 == 1) {
          convert_numerative_pron(in_stack_000003e0,in_stack_000003d8,in_stack_000003d0);
        }
        else {
          iVar1 = search_numerative_class
                            (&in_stack_ffffffffffffffc8->string,in_stack_ffffffffffffffc0);
          if (iVar1 == 1) {
            convert_numerative_pron(in_stack_000003e0,in_stack_000003d8,in_stack_000003d0);
          }
          else {
            iVar1 = search_numerative_class
                              (&in_stack_ffffffffffffffc8->string,in_stack_ffffffffffffffc0);
            if (iVar1 == 1) {
              convert_numerative_pron(in_stack_000003e0,in_stack_000003d8,in_stack_000003d0);
            }
            else {
              iVar1 = search_numerative_class
                                (&in_stack_ffffffffffffffc8->string,in_stack_ffffffffffffffc0);
              if (iVar1 == 1) {
                convert_numerative_pron(in_stack_000003e0,in_stack_000003d8,in_stack_000003d0);
              }
              else {
                iVar1 = search_numerative_class
                                  (&in_stack_ffffffffffffffc8->string,in_stack_ffffffffffffffc0);
                if (iVar1 == 1) {
                  convert_numerative_pron(in_stack_000003e0,in_stack_000003d8,in_stack_000003d0);
                }
              }
            }
          }
        }
        NJDNode_set_chain_flag(p_Var6->prev,0);
        NJDNode_set_chain_flag(p_Var6,1);
      }
LAB_001824ba:
    }
    for (p_Var6 = *(_NJDNode **)(in_RDI->string + 0x70); p_Var6 != (_NJDNode *)0x0;
        p_Var6 = p_Var6->next) {
      pcVar3 = NJDNode_get_pos_group1(p_Var6->prev);
      iVar1 = strcmp(pcVar3,anon_var_dwarf_b48b2 + 9);
      if (iVar1 == 0) {
        pcVar3 = NJDNode_get_pos_group1(p_Var6);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_b48b2 + 9);
        if (((iVar1 == 0) && (pcVar3 = NJDNode_get_string(p_Var6->prev), pcVar3 != (char *)0x0)) &&
           (pcVar3 = NJDNode_get_string(p_Var6), pcVar3 != (char *)0x0)) {
          bVar4 = false;
          for (iVar1 = 0; njd_set_digit_rule_numeral_list4[iVar1] != (char *)0x0; iVar1 = iVar1 + 1)
          {
            pcVar3 = NJDNode_get_string(p_Var6->prev);
            iVar2 = strcmp(pcVar3,njd_set_digit_rule_numeral_list4[iVar1]);
            if (iVar2 == 0) {
              iVar1 = 0;
              goto LAB_001825ba;
            }
          }
LAB_00182640:
          if (!bVar4) {
            for (iVar1 = 0; njd_set_digit_rule_numeral_list5[iVar1] != (char *)0x0;
                iVar1 = iVar1 + 1) {
              pcVar3 = NJDNode_get_string(p_Var6->prev);
              iVar2 = strcmp(pcVar3,njd_set_digit_rule_numeral_list5[iVar1]);
              if (iVar2 == 0) {
                iVar1 = 0;
                goto LAB_0018269d;
              }
            }
          }
        }
LAB_0018270c:
        iVar1 = search_numerative_class
                          (&in_stack_ffffffffffffffc8->string,in_stack_ffffffffffffffc0);
        if (iVar1 == 1) {
          convert_digit_pron(&list->string,p_Var6);
        }
        iVar1 = search_numerative_class
                          (&in_stack_ffffffffffffffc8->string,in_stack_ffffffffffffffc0);
        if (iVar1 == 1) {
          convert_digit_pron(&list->string,p_Var6);
        }
        iVar1 = search_numerative_class
                          (&in_stack_ffffffffffffffc8->string,in_stack_ffffffffffffffc0);
        if (iVar1 == 1) {
          convert_numerative_pron(in_stack_000003e0,in_stack_000003d8,in_stack_000003d0);
        }
      }
    }
    for (p_Var6 = (_NJDNode *)in_RDI->string; p_Var6 != (_NJDNode *)0x0; p_Var6 = p_Var6->next) {
      if (p_Var6->next != (_NJDNode *)0x0) {
        pcVar3 = NJDNode_get_string(p_Var6->next);
        iVar1 = strcmp(pcVar3,"*");
        if (iVar1 != 0) {
          pcVar3 = NJDNode_get_pos_group1(p_Var6);
          iVar1 = strcmp(pcVar3,anon_var_dwarf_b48b2 + 9);
          if (iVar1 == 0) {
            if (p_Var6->prev != (_NJDNode *)0x0) {
              pcVar3 = NJDNode_get_pos(p_Var6->prev);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_b1891);
              if (iVar1 != 0) {
                pcVar3 = NJDNode_get_pos_group1(p_Var6->prev);
                iVar1 = strcmp(pcVar3,anon_var_dwarf_b48b2 + 9);
                if (iVar1 == 0) goto LAB_00182cec;
              }
            }
            pcVar3 = NJDNode_get_pos_group2(p_Var6->next);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d1e);
            if (iVar1 != 0) {
              pcVar3 = NJDNode_get_pos_group1(p_Var6->next);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d35);
              if (iVar1 != 0) goto LAB_00182cec;
            }
            for (iVar1 = 0; njd_set_digit_rule_numerative_class3[iVar1] != (char *)0x0;
                iVar1 = iVar1 + 2) {
              pcVar3 = NJDNode_get_string(p_Var6->next);
              iVar2 = strcmp(pcVar3,njd_set_digit_rule_numerative_class3[iVar1]);
              if (iVar2 == 0) {
                pcVar3 = NJDNode_get_read(p_Var6->next);
                iVar2 = strcmp(pcVar3,njd_set_digit_rule_numerative_class3[iVar1 + 1]);
                if (iVar2 == 0) {
                  iVar1 = 0;
                  goto LAB_00182940;
                }
              }
            }
LAB_00182a48:
            pcVar3 = NJDNode_get_string(p_Var6->next);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d57);
            if (iVar1 == 0) {
              for (iVar1 = 0; njd_set_digit_rule_conv_table4[iVar1] != (char *)0x0;
                  iVar1 = iVar1 + 2) {
                pcVar3 = NJDNode_get_string(p_Var6);
                iVar2 = strcmp(pcVar3,njd_set_digit_rule_conv_table4[iVar1]);
                if (iVar2 == 0) {
                  NJDNode_load(in_stack_000017f0,in_stack_000017e8);
                  NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                   (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                    in_stack_ffffffffffffffb8));
                  break;
                }
              }
            }
            pcVar3 = NJDNode_get_string(p_Var6->next);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d62);
            if (iVar1 == 0) {
              pcVar3 = NJDNode_get_string(p_Var6);
              iVar1 = strcmp(pcVar3,"*");
              if (iVar1 != 0) {
                if (p_Var6->prev != (_NJDNode *)0x0) {
                  pcVar3 = NJDNode_get_string(p_Var6->prev);
                  pcVar3 = strstr(pcVar3,anon_var_dwarf_b3603 + 3);
                  if (pcVar3 != (char *)0x0) {
                    pcVar3 = NJDNode_get_string(p_Var6);
                    iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d78);
                    if (iVar1 == 0) {
                      NJDNode_load(in_stack_000017f0,in_stack_000017e8);
                      NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                       (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                        in_stack_ffffffffffffffb8));
                      goto LAB_00182cec;
                    }
                  }
                }
                for (iVar1 = 0; njd_set_digit_rule_conv_table5[iVar1] != (char *)0x0;
                    iVar1 = iVar1 + 2) {
                  pcVar3 = NJDNode_get_string(p_Var6);
                  iVar2 = strcmp(pcVar3,njd_set_digit_rule_conv_table5[iVar1]);
                  if (iVar2 == 0) {
                    NJDNode_load(in_stack_000017f0,in_stack_000017e8);
                    NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                     (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                      in_stack_ffffffffffffffb8));
                    break;
                  }
                }
                goto LAB_00182cec;
              }
            }
            pcVar3 = NJDNode_get_string(p_Var6->next);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d9a);
            if (iVar1 == 0) {
              for (iVar1 = 0; njd_set_digit_rule_conv_table6[iVar1] != (char *)0x0;
                  iVar1 = iVar1 + 2) {
                pcVar3 = NJDNode_get_string(p_Var6);
                iVar2 = strcmp(pcVar3,njd_set_digit_rule_conv_table6[iVar1]);
                if (iVar2 == 0) {
                  NJDNode_load(in_stack_000017f0,in_stack_000017e8);
                  NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                   (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                    in_stack_ffffffffffffffb8));
                  break;
                }
              }
            }
          }
        }
      }
LAB_00182cec:
    }
    for (p_Var6 = (_NJDNode *)in_RDI->string; p_Var6 != (_NJDNode *)0x0; p_Var6 = p_Var6->next) {
      if (p_Var6->prev == (_NJDNode *)0x0) {
LAB_00182d4c:
        if ((p_Var6->next != (_NJDNode *)0x0) && (p_Var6->next->next != (_NJDNode *)0x0)) {
          pcVar3 = NJDNode_get_string(p_Var6);
          iVar1 = strcmp(pcVar3,anon_var_dwarf_b2da5);
          if (iVar1 == 0) {
            pcVar3 = NJDNode_get_string(p_Var6->next);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_b2db0);
            if (iVar1 == 0) {
              pcVar3 = NJDNode_get_string(p_Var6->next->next);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d62);
              if (iVar1 == 0) {
                NJDNode_load(in_stack_000017f0,in_stack_000017e8);
                NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                 (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8));
                NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                 (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8));
              }
              else {
                pcVar3 = NJDNode_get_string(p_Var6->next->next);
                iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d9a);
                if (iVar1 == 0) {
                  NJDNode_load(in_stack_000017f0,in_stack_000017e8);
                  NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                   (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                    in_stack_ffffffffffffffb8));
                  NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                   (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                    in_stack_ffffffffffffffb8));
                }
              }
              goto LAB_001830e4;
            }
          }
          pcVar3 = NJDNode_get_string(p_Var6);
          iVar1 = strcmp(pcVar3,anon_var_dwarf_b2cdc);
          if (iVar1 == 0) {
            pcVar3 = NJDNode_get_string(p_Var6->next);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_b2da5);
            if (iVar1 == 0) {
              pcVar3 = NJDNode_get_string(p_Var6->next->next);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d62);
              if (iVar1 == 0) {
                NJDNode_load(in_stack_000017f0,in_stack_000017e8);
                NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                 (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8));
                NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                 (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8));
              }
              else {
                pcVar3 = NJDNode_get_string(p_Var6->next->next);
                iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d9a);
                if (iVar1 == 0) {
                  NJDNode_load(in_stack_000017f0,in_stack_000017e8);
                  NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                   (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                    in_stack_ffffffffffffffb8));
                  NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                   (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                    in_stack_ffffffffffffffb8));
                }
                else {
                  pcVar3 = NJDNode_get_string(p_Var6->next->next);
                  iVar1 = strcmp(pcVar3,anon_var_dwarf_b2db0);
                  if ((iVar1 == 0) && (p_Var6->next->next->next != (_NJDNode *)0x0)) {
                    pcVar3 = NJDNode_get_string(p_Var6->next->next->next);
                    iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d62);
                    if (iVar1 == 0) {
                      NJDNode_load(in_stack_000017f0,in_stack_000017e8);
                      NJDNode_load(in_stack_000017f0,in_stack_000017e8);
                      NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                       (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                        in_stack_ffffffffffffffb8));
                      NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                       (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                        in_stack_ffffffffffffffb8));
                    }
                    else {
                      pcVar3 = NJDNode_get_string(p_Var6->next->next->next);
                      iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d9a);
                      if (iVar1 == 0) {
                        NJDNode_load(in_stack_000017f0,in_stack_000017e8);
                        NJDNode_load(in_stack_000017f0,in_stack_000017e8);
                        NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                         (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                          in_stack_ffffffffffffffb8));
                        NJDNode_set_pron(in_stack_ffffffffffffffc0,
                                         (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                          in_stack_ffffffffffffffb8));
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        pcVar3 = NJDNode_get_pos_group1(p_Var6->prev);
        iVar1 = strcmp(pcVar3,anon_var_dwarf_b48b2 + 9);
        if (iVar1 != 0) goto LAB_00182d4c;
      }
LAB_001830e4:
    }
    NJD_remove_silent_node((NJD *)in_stack_ffffffffffffffc0);
  }
  return;
LAB_001825ba:
  if (njd_set_digit_rule_numeral_list5[iVar1] == (char *)0x0) goto LAB_00182640;
  pcVar3 = NJDNode_get_string(p_Var6);
  iVar2 = strcmp(pcVar3,njd_set_digit_rule_numeral_list5[iVar1]);
  if (iVar2 == 0) {
    NJDNode_set_chain_flag(p_Var6->prev,0);
    NJDNode_set_chain_flag(p_Var6,1);
    bVar4 = true;
    goto LAB_00182640;
  }
  iVar1 = iVar1 + 1;
  goto LAB_001825ba;
LAB_0018269d:
  if (njd_set_digit_rule_numeral_list4[iVar1] == (char *)0x0) goto LAB_0018270c;
  pcVar3 = NJDNode_get_string(p_Var6);
  iVar2 = strcmp(pcVar3,njd_set_digit_rule_numeral_list4[iVar1]);
  if (iVar2 == 0) {
    NJDNode_set_chain_flag(p_Var6,0);
    goto LAB_0018270c;
  }
  iVar1 = iVar1 + 1;
  goto LAB_0018269d;
LAB_00182940:
  if (njd_set_digit_rule_conv_table3[iVar1] == (char *)0x0) goto LAB_00182a48;
  pcVar3 = NJDNode_get_string(p_Var6);
  iVar2 = strcmp(pcVar3,njd_set_digit_rule_conv_table3[iVar1]);
  if (iVar2 == 0) {
    NJDNode_set_read(in_stack_ffffffffffffffc0,
                     (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    NJDNode_set_pron(in_stack_ffffffffffffffc0,
                     (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    in_stack_ffffffffffffffc0 = p_Var6;
    p_Var6 = in_stack_ffffffffffffffc0;
    atoi(njd_set_digit_rule_conv_table3[iVar1 + 2]);
    NJDNode_set_acc(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    atoi(njd_set_digit_rule_conv_table3[iVar1 + 3]);
    NJDNode_set_mora_size(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    goto LAB_00182a48;
  }
  iVar1 = iVar1 + 4;
  goto LAB_00182940;
}

Assistant:

void njd_set_digit(NJD * njd)
{
   int i, j;
   NJDNode *s = NULL;
   NJDNode *e = NULL;
   NJDNode *node;
   int find = 0;

   /* convert digit sequence */
   for (node = njd->head; node != NULL; node = node->next) {
      if (find == 0 && strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0)
         find = 1;
      if (get_digit(node, 1) >= 0 ||
          (strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0 &&
           (is_period(NJDNode_get_string(node)) == 1 || is_comma(NJDNode_get_string(node)) == 1)
          )) {
         if (s == NULL)
            s = node;
         if (node == njd->tail)
            e = node;
      } else {
         if (s != NULL)
            e = node->prev;
      }
      if (s != NULL && e != NULL) {
         convert_digit_sequence(njd, s, e);
         s = e = NULL;
      }
   }
   if (find == 0)
      return;
   NJD_remove_silent_node(njd);
   if (njd->head == NULL)
      return;

   for (node = njd->head->next; node != NULL && node->next != NULL;) {
      if (strcmp(NJDNode_get_string(node), "*") != 0
          && strcmp(NJDNode_get_string(node->prev), "*") != 0
          && is_period(NJDNode_get_string(node)) == 1
          && strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) == 0
          && strcmp(NJDNode_get_pos_group1(node->next), NJD_SET_DIGIT_KAZU) == 0) {
         NJDNode_load(node, NJD_SET_DIGIT_TEN_FEATURE);
         NJDNode_set_chain_flag(node, 1);
         if (strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_ZERO1) == 0
             || strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_ZERO2) == 0) {
            NJDNode_set_pron(node->prev, NJD_SET_DIGIT_ZERO_BEFORE_DP);
            NJDNode_set_mora_size(node->prev, 2);
         } else if (strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_TWO) == 0) {
            NJDNode_set_pron(node->prev, NJD_SET_DIGIT_TWO_BEFORE_DP);
            NJDNode_set_mora_size(node->prev, 2);
         } else if (strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_FIVE) == 0) {
            NJDNode_set_pron(node->prev, NJD_SET_DIGIT_FIVE_BEFORE_DP);
            NJDNode_set_mora_size(node->prev, 2);
         } else if (strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_SIX) == 0) {
            NJDNode_set_acc(node->prev, 1);
         }
         /* skip digit sequence */
         node = node->next;
         while (node && strcmp(NJDNode_get_pos(node), NJD_SET_DIGIT_MEISHI) == 0)
            node = node->next;
         if (node)
            node = node->next;
      } else {
         node = node->next;
      }
   }

   for (node = njd->head->next; node != NULL; node = node->next) {
      if (strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) == 0) {
         if (strcmp(NJDNode_get_pos_group2(node), NJD_SET_DIGIT_JOSUUSHI) == 0
             || strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_FUKUSHIKANOU) == 0) {
            /* convert digit pron */
            if (search_numerative_class(njd_set_digit_rule_numerative_class1b, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1b, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1c1, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1c1, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1c2, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1c2, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1d, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1d, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1e, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1e, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1f, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1f, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1g, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1g, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1h, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1h, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1i, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1i, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1j, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1j, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1k, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1k, node->prev);
            /* convert numerative pron */
            if (search_numerative_class(njd_set_digit_rule_numerative_class2b, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2b, node->prev, node);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class2c, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2c, node->prev, node);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class2d, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2d, node->prev, node);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class2e, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2e, node->prev, node);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class2f, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2f, node->prev, node);
            /* modify accent phrase */
            NJDNode_set_chain_flag(node->prev, 0);
            NJDNode_set_chain_flag(node, 1);
         }
      }
   }

   for (node = njd->head->next; node != NULL; node = node->next) {
      if (strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) == 0) {
         if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0
             && NJDNode_get_string(node->prev) != NULL && NJDNode_get_string(node) != NULL) {
            /* modify accent phrase */
            find = 0;
            for (i = 0; njd_set_digit_rule_numeral_list4[i] != NULL; i++) {
               if (strcmp(NJDNode_get_string(node->prev), njd_set_digit_rule_numeral_list4[i]) == 0) {
                  for (j = 0; njd_set_digit_rule_numeral_list5[j] != NULL; j++) {
                     if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_numeral_list5[j]) == 0) {
                        NJDNode_set_chain_flag(node->prev, 0);
                        NJDNode_set_chain_flag(node, 1);
                        find = 1;
                        break;
                     }
                  }
                  break;
               }
            }
            if (find == 0) {
               for (i = 0; njd_set_digit_rule_numeral_list5[i] != NULL; i++) {
                  if (strcmp(NJDNode_get_string(node->prev), njd_set_digit_rule_numeral_list5[i]) ==
                      0) {
                     for (j = 0; njd_set_digit_rule_numeral_list4[j] != NULL; j++) {
                        if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_numeral_list4[j]) ==
                            0) {
                           NJDNode_set_chain_flag(node, 0);
                           break;
                        }
                     }
                     break;
                  }
               }
            }
         }
         if (search_numerative_class(njd_set_digit_rule_numeral_list8, node) == 1)
            convert_digit_pron(njd_set_digit_rule_numeral_list9, node->prev);
         if (search_numerative_class(njd_set_digit_rule_numeral_list10, node) == 1)
            convert_digit_pron(njd_set_digit_rule_numeral_list11, node->prev);
         if (search_numerative_class(njd_set_digit_rule_numeral_list6, node) == 1)
            convert_numerative_pron(njd_set_digit_rule_numeral_list7, node->prev, node);
      }
   }

   for (node = njd->head; node != NULL; node = node->next) {
      if (node->next != NULL &&
          strcmp(NJDNode_get_string(node->next), "*") != 0 &&
          strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0 &&
          (node->prev == NULL
           || strcmp(NJDNode_get_pos(node->prev), NJD_SET_DIGIT_KIGOU) == 0
           || strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) != 0)
          && (strcmp(NJDNode_get_pos_group2(node->next), NJD_SET_DIGIT_JOSUUSHI) == 0
              || strcmp(NJDNode_get_pos_group1(node->next), NJD_SET_DIGIT_FUKUSHIKANOU) == 0)) {
         /* convert class3 */
         for (i = 0; njd_set_digit_rule_numerative_class3[i] != NULL; i += 2) {
            if (strcmp(NJDNode_get_string(node->next), njd_set_digit_rule_numerative_class3[i]) == 0
                && strcmp(NJDNode_get_read(node->next),
                          njd_set_digit_rule_numerative_class3[i + 1]) == 0) {
               for (j = 0; njd_set_digit_rule_conv_table3[j] != NULL; j += 4) {
                  if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_conv_table3[j]) == 0) {
                     NJDNode_set_read(node, (char *) njd_set_digit_rule_conv_table3[j + 1]);
                     NJDNode_set_pron(node, (char *) njd_set_digit_rule_conv_table3[j + 1]);
                     NJDNode_set_acc(node, atoi(njd_set_digit_rule_conv_table3[j + 2]));
                     NJDNode_set_mora_size(node, atoi(njd_set_digit_rule_conv_table3[j + 3]));
                     break;
                  }
               }
               break;
            }
         }
         /* person */
         if (strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_NIN) == 0) {
            for (i = 0; njd_set_digit_rule_conv_table4[i] != NULL; i += 2) {
               if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_conv_table4[i]) == 0) {
                  NJDNode_load(node, (char *) njd_set_digit_rule_conv_table4[i + 1]);
                  NJDNode_set_pron(node->next, NULL);
                  break;
               }
            }
         }
         /* the day of month */
         if (strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_NICHI) == 0
             && strcmp(NJDNode_get_string(node), "*") != 0) {
            if (node->prev != NULL
                && strstr(NJDNode_get_string(node->prev), NJD_SET_DIGIT_GATSU) != NULL
                && strcmp(NJDNode_get_string(node), NJD_SET_DIGIT_ONE) == 0) {
               NJDNode_load(node, NJD_SET_DIGIT_TSUITACHI);
               NJDNode_set_pron(node->next, NULL);
            } else {
               for (i = 0; njd_set_digit_rule_conv_table5[i] != NULL; i += 2) {
                  if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_conv_table5[i]) == 0) {
                     NJDNode_load(node, (char *) njd_set_digit_rule_conv_table5[i + 1]);
                     NJDNode_set_pron(node->next, NULL);
                     break;
                  }
               }
            }
         } else if (strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_NICHIKAN) == 0) {
            for (i = 0; njd_set_digit_rule_conv_table6[i] != NULL; i += 2) {
               if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_conv_table6[i]) == 0) {
                  NJDNode_load(node, (char *) njd_set_digit_rule_conv_table6[i + 1]);
                  NJDNode_set_pron(node->next, NULL);
                  break;
               }
            }
         }
      }
   }

   for (node = njd->head; node != NULL; node = node->next) {
      if ((node->prev == NULL
           || strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) != 0)
          && node->next != NULL && node->next->next != NULL) {
         if (strcmp(NJDNode_get_string(node), NJD_SET_DIGIT_TEN) == 0
             && strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_FOUR) == 0) {
            if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_NICHI) == 0) {
               NJDNode_load(node, NJD_SET_DIGIT_JUYOKKA);
               NJDNode_set_pron(node->next, NULL);
               NJDNode_set_pron(node->next->next, NULL);
            } else if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_NICHIKAN) == 0) {
               NJDNode_load(node, NJD_SET_DIGIT_JUYOKKAKAN);
               NJDNode_set_pron(node->next, NULL);
               NJDNode_set_pron(node->next->next, NULL);
            }
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_DIGIT_TWO) == 0
                    && strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_TEN) == 0) {
            if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_NICHI) == 0) {
               NJDNode_load(node, NJD_SET_DITIT_HATSUKA);
               NJDNode_set_pron(node->next, NULL);
               NJDNode_set_pron(node->next->next, NULL);
            } else if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_NICHIKAN) == 0) {
               NJDNode_load(node, NJD_SET_DIGIT_HATSUKAKAN);
               NJDNode_set_pron(node->next, NULL);
               NJDNode_set_pron(node->next->next, NULL);
            } else if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_FOUR) == 0
                       && node->next->next->next != NULL) {
               if (strcmp(NJDNode_get_string(node->next->next->next), NJD_SET_DIGIT_NICHI) == 0) {
                  NJDNode_load(node, NJD_SET_DIGIT_NIJU);
                  NJDNode_load(node->next, NJD_SET_DITIT_YOKKA);
                  NJDNode_set_pron(node->next->next, NULL);
                  NJDNode_set_pron(node->next->next->next, NULL);
               } else if (strcmp(NJDNode_get_string(node->next->next->next), NJD_SET_DIGIT_NICHIKAN)
                          == 0) {
                  NJDNode_load(node, NJD_SET_DIGIT_NIJU);
                  NJDNode_load(node->next, NJD_SET_DIGIT_YOKKAKAN);
                  NJDNode_set_pron(node->next->next, NULL);
                  NJDNode_set_pron(node->next->next->next, NULL);
               }
            }
         }
      }
   }

   NJD_remove_silent_node(njd);
   if (njd->head == NULL)
      return;
}